

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LE_Detonation_PDU.cpp
# Opt level: O2

void __thiscall KDIS::PDU::LE_Detonation_PDU::checkFlagsAndPDULength(LE_Detonation_PDU *this)

{
  LE_EntityIdentifier *pLVar1;
  KUINT16 *pKVar2;
  KBOOL KVar3;
  KUINT8 KVar4;
  KUINT8 KVar5;
  
  if (((this->m_DetonationFlag1Union).m_ui8Flag & 4) == 0) {
LAB_0014e798:
    KVar3 = false;
  }
  else {
    pLVar1 = &(this->super_LE_Header).m_EntID;
    KVar4 = DATA_TYPE::LE_EntityIdentifier::GetSiteID(pLVar1);
    KVar5 = DATA_TYPE::LE_EntityIdentifier::GetSiteID(&this->m_MunitionID);
    if (KVar4 == KVar5) {
      KVar4 = DATA_TYPE::LE_EntityIdentifier::GetApplicationID(pLVar1);
      KVar5 = DATA_TYPE::LE_EntityIdentifier::GetApplicationID(&this->m_MunitionID);
      if (KVar4 == KVar5) goto LAB_0014e798;
    }
    KVar3 = true;
  }
  SetMunitionEntityIDSiteAppIncludedFlag(this,KVar3);
  pLVar1 = &(this->super_LE_Header).m_EntID;
  KVar4 = DATA_TYPE::LE_EntityIdentifier::GetSiteID(pLVar1);
  KVar5 = DATA_TYPE::LE_EntityIdentifier::GetSiteID(&this->m_EventID);
  if (KVar4 == KVar5) {
    KVar4 = DATA_TYPE::LE_EntityIdentifier::GetApplicationID(pLVar1);
    KVar5 = DATA_TYPE::LE_EntityIdentifier::GetApplicationID(&this->m_EventID);
    if (KVar4 == KVar5) {
      KVar3 = false;
      goto LAB_0014e81b;
    }
  }
  KVar3 = true;
LAB_0014e81b:
  SetEventIDSiteAppIncludedFlag(this,KVar3);
  if (((this->m_DetonationFlag2Union).m_ui8Flag & 3) != 0) {
    SetFlag2Flag(this,true);
    return;
  }
  if ((char)(this->m_DetonationFlag1Union).m_ui8Flag < '\0') {
    (this->m_DetonationFlag1Union).m_ui8Flag = (this->m_DetonationFlag1Union).m_ui8Flag & 0x7f;
    pKVar2 = &(this->super_LE_Header).super_Header.super_Header6.m_ui16PDULength;
    *pKVar2 = *pKVar2 - 1;
  }
  return;
}

Assistant:

void LE_Detonation_PDU::checkFlagsAndPDULength()
{
    // Check if the Munition ID field is included and set dependent
    // values accordingly.
    if( GetMunitionEntityIDFlag() )
    {
        // Check if the munition's's site and application values
        // are the same, if they are we don't include them.
        if( m_EntID.GetSiteID() == m_MunitionID.GetSiteID() &&
                m_EntID.GetApplicationID() == m_MunitionID.GetApplicationID() )
        {
            // They match so don't include the fields
            SetMunitionEntityIDSiteAppIncludedFlag( false );
        }
        else
        {
            // They don't match so we need to send these fields.
            SetMunitionEntityIDSiteAppIncludedFlag( true );
        }
    }
    else
    {
        SetMunitionEntityIDSiteAppIncludedFlag( false );
    }

    // Now check the event's site and application values
    if( m_EntID.GetSiteID() == m_EventID.GetSiteID() &&
            m_EntID.GetApplicationID() == m_EventID.GetApplicationID() )
    {
        SetEventIDSiteAppIncludedFlag( false );
    }
    else
    {
        SetEventIDSiteAppIncludedFlag( true );
    }

    // Check if the Event Number field or the Munition Orientation field
    // are set. Make sure that the Flag Octet 2 is set accordingly.
    if( GetMunitionOrientationFlag() || GetEventNumberIncludedFlag() )
    {
        SetFlag2Flag( true );
    }
    else
    {
        SetFlag2Flag( false );
    }

#ifdef _DEBUG
    {
        // Verify PDU length
        const KUINT16 ui16ExpectedPDULength = 32
            + 1*m_DetonationFlag1Union.m_ui8Flag2
            + 4*m_DetonationFlag1Union.m_ui8TargetId
            + (2*m_DetonationFlag1Union.m_ui8MunitionSiteApp + 2)*m_DetonationFlag1Union.m_ui8MunitionId
            + (2*m_DetonationFlag1Union.m_ui8EventSiteAppId + 2)*m_DetonationFlag2Union.m_ui8EventNum
            + 8*(1 - m_DetonationFlag1Union.m_ui8LocationTyp)
            + 6*m_DetonationFlag2Union.m_ui8MunitionOri
            + 4*m_DetonationFlag1Union.m_ui8WarheadFuse
            + 4*m_DetonationFlag1Union.m_ui8QuantRate
            + 6*m_DetonationFlag1Union.m_ui8LocationTyp;
        assert(ui16ExpectedPDULength == m_ui16PDULength);
    }
#endif
}